

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb.c
# Opt level: O3

int cubeb_set_log_callback(cubeb_log_level log_level,cubeb_log_callback log_callback)

{
  int iVar1;
  cubeb_log_callback p_Var2;
  
  iVar1 = -2;
  if ((log_level < (CUBEB_LOG_VERBOSE|CUBEB_LOG_NORMAL)) &&
     (iVar1 = -3, log_level == CUBEB_LOG_DISABLED || log_callback != (cubeb_log_callback)0x0)) {
    p_Var2 = cubeb_log_get_callback();
    iVar1 = -4;
    if (log_callback == (cubeb_log_callback)0x0 || p_Var2 == (cubeb_log_callback)0x0) {
      cubeb_log_set(log_level,log_callback);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
cubeb_set_log_callback(cubeb_log_level log_level,
                       cubeb_log_callback log_callback)
{
  if (log_level < CUBEB_LOG_DISABLED || log_level > CUBEB_LOG_VERBOSE) {
    return CUBEB_ERROR_INVALID_FORMAT;
  }

  if (!log_callback && log_level != CUBEB_LOG_DISABLED) {
    return CUBEB_ERROR_INVALID_PARAMETER;
  }

  if (cubeb_log_get_callback() && log_callback) {
    return CUBEB_ERROR_NOT_SUPPORTED;
  }

  cubeb_log_set(log_level, log_callback);

  return CUBEB_OK;
}